

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O1

int logger_function_as_parameter_test(void)

{
  undefined1 *this;
  long lVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  SimpleLogger *this_00;
  LoggerStream *src;
  size_type *psVar5;
  int jj;
  uint target_level;
  int level;
  LoggerStream *pLVar6;
  long *in_FS_OFFSET;
  string filename;
  string prefix;
  string local_50;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&prefix,"logger_function_as_parameter_test","");
  TestSuite::clearTestFile(&prefix,MIDDLE_OF_TEST);
  TestSuite::getTestFileName(&local_50,&prefix);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    filename.field_2._M_allocated_capacity = *psVar5;
    filename.field_2._8_8_ = plVar4[3];
  }
  else {
    filename.field_2._M_allocated_capacity = *psVar5;
    filename._M_dataplus._M_p = (pointer)*plVar4;
  }
  filename._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::chrono::_V2::system_clock::now();
  this_00 = (SimpleLogger *)operator_new(0x2c8);
  SimpleLogger::SimpleLogger(this_00,&filename,0x80,0x100000,0);
  SimpleLogger::start(this_00);
  SimpleLogger::setLogLevel(this_00,6);
  lVar1 = *in_FS_OFFSET;
  pLVar6 = (LoggerStream *)0x1;
  do {
    level = (int)pLVar6;
    SimpleLogger::setLogLevel(this_00,level);
    src = pLVar6;
    SimpleLogger::setDispLevel(this_00,level);
    target_level = 1;
    do {
      if ((int)target_level <= (this_00->curLogLevel).super___atomic_base<int>._M_i) {
        uVar2 = function_parameter(level,target_level);
        src = (LoggerStream *)(ulong)target_level;
        SimpleLogger::put(this_00,target_level,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_function_as_parameter_test",0x130,
                          "logger level %d, target level %d",pLVar6,(ulong)uVar2);
      }
      if ((int)target_level <= (this_00->curLogLevel).super___atomic_base<int>._M_i) {
        src = SimpleLogger::stream
                        (this_00,target_level,this_00,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                         ,"logger_function_as_parameter_test",0x131);
        this = &(src->super_ostream).field_0x80;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"logger level ",0xd);
        std::ostream::operator<<(this,level);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"target level ",0xd);
        iVar3 = function_parameter(level,target_level);
        std::ostream::operator<<(this,iVar3);
        if ((char)in_FS_OFFSET[-0xd] == '\0') {
          *(undefined1 *)(in_FS_OFFSET + -0xd) = 1;
        }
        SimpleLogger::EndOfStmt::operator=((EndOfStmt *)(lVar1 + -0x70),src);
      }
      iVar3 = (int)src;
      target_level = target_level + 1;
    } while (target_level != 7);
    pLVar6 = (LoggerStream *)(ulong)(level + 1U);
  } while (level + 1U != 7);
  SimpleLogger::~SimpleLogger(this_00);
  operator_delete(this_00);
  SimpleLogger::shutdown((int)this_00,iVar3);
  TestSuite::clearTestFile(&prefix,END_OF_TEST);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int logger_reclaim_test(uint64_t num) {
    const std::string prefix = TEST_SUITE_AUTO_PREFIX;
    TestSuite::clearTestFile(prefix);
    std::string filename = TestSuite::getTestFileName(prefix) + ".log";

    uint64_t ii=0;
    SimpleLogger* ll = nullptr;
    TestSuite::Timer tt;

    ll = new SimpleLogger(filename, 128, 1024*1024, 4);
    ll->start();
    ll->setLogLevel(6);
    for (; ii<num/2; ++ii) {
        if (ii && ii % 100000 == 0) {
            _log_info(ll, "%ld: %ld", ii, tt.getTimeUs());
        } else {
            _log_trace(ll, "%ld: %ld", ii, tt.getTimeUs());
        }
    }
    delete ll;

    ll = new SimpleLogger(filename, 128, 1024*1024, 4);
    ll->start();
    ll->setLogLevel(6);
    for (; ii<num; ++ii) {
        if (ii && ii % 100000 == 0) {
            _log_info(ll, "%ld: %ld", ii, tt.getTimeUs());
        } else {
            _log_trace(ll, "%ld: %ld", ii, tt.getTimeUs());
        }
    }
    delete ll;

    SimpleLogger::shutdown();
    TestSuite::clearTestFile(prefix, TestSuite::END_OF_TEST);
    return 0;
}